

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O1

bool CB_ADF::test_adf_sequence(multi_ex *ec_seq)

{
  float fVar1;
  pointer ppeVar2;
  example *peVar3;
  wclass *pwVar4;
  vw_exception *pvVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  stringstream __msg;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  ppeVar2 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar6 = (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)ppeVar2;
  if (lVar6 == 0) {
    uVar7 = 0;
  }
  else {
    lVar6 = lVar6 >> 3;
    lVar8 = 0;
    uVar7 = 0;
    do {
      peVar3 = ppeVar2[lVar8];
      pwVar4 = (peVar3->l).cs.costs._begin;
      uVar9 = (long)(peVar3->l).cs.costs._end - (long)pwVar4;
      if (0x10 < uVar9) {
        std::__cxx11::stringstream::stringstream(local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_190,"cb_adf: badly formatted example, only one cost can be known.",0x3c);
        pvVar5 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar5,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cb_adf.cc"
                   ,0xdd,&local_1c0);
        __cxa_throw(pvVar5,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      if ((uVar9 == 0x10) && ((fVar1 = pwVar4->x, fVar1 != 3.4028235e+38 || (NAN(fVar1))))) {
        uVar7 = uVar7 + 1;
      }
      lVar8 = lVar8 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar8);
  }
  if (1 < uVar7) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_190,"cb_adf: badly formatted example, only one line can have a cost",0x3e);
    pvVar5 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar5,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cb_adf.cc"
               ,0xe7,&local_1e0);
    __cxa_throw(pvVar5,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  return uVar7 == 0;
}

Assistant:

bool test_adf_sequence(multi_ex& ec_seq)
{
  uint32_t count = 0;
  for (size_t k = 0; k < ec_seq.size(); k++)
  {
    example* ec = ec_seq[k];
    if (ec->l.cb.costs.size() > 1)
      THROW("cb_adf: badly formatted example, only one cost can be known.");

    if (ec->l.cb.costs.size() == 1 && ec->l.cb.costs[0].cost != FLT_MAX)
      count += 1;
  }
  if (count == 0)
    return true;
  else if (count == 1)
    return false;
  else
    THROW("cb_adf: badly formatted example, only one line can have a cost");
}